

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O1

void cf_blockwise_acc_pad
               (uint8_t *partial,size_t *npartial,size_t nblock,uint8_t fbyte,uint8_t mbyte,
               uint8_t lbyte,size_t nbytes,cf_blockwise_in_fn process,void *ctx)

{
  uint8_t *inp;
  uint8_t lbyte_local;
  uint8_t fbyte_local;
  
  if (nbytes == 0) {
    return;
  }
  if (nbytes == 2) {
    cf_blockwise_accumulate_final(partial,npartial,nblock,&fbyte_local,1,process,process,ctx);
  }
  else {
    if (nbytes == 1) {
      inp = &fbyte_local;
      goto LAB_0010a5ba;
    }
    cf_blockwise_accumulate_final(partial,npartial,nblock,&fbyte_local,1,process,process,ctx);
    if (lbyte == mbyte) {
      cf_blockwise_acc_byte(partial,npartial,nblock,mbyte,nbytes - 1,process,ctx);
      return;
    }
    cf_blockwise_acc_byte(partial,npartial,nblock,mbyte,nbytes - 2,process,ctx);
  }
  inp = &lbyte_local;
LAB_0010a5ba:
  cf_blockwise_accumulate_final(partial,npartial,nblock,inp,1,process,process,ctx);
  return;
}

Assistant:

void cf_blockwise_acc_pad(uint8_t *partial, size_t *npartial,
                          size_t nblock,
                          uint8_t fbyte, uint8_t mbyte, uint8_t lbyte,
                          size_t nbytes,
                          cf_blockwise_in_fn process,
                          void *ctx)
{

  switch (nbytes)
  {
    case 0: break;
    case 1: fbyte ^= lbyte;
            cf_blockwise_accumulate(partial, npartial, nblock, &fbyte, 1, process, ctx);
            break;
    case 2:
            cf_blockwise_accumulate(partial, npartial, nblock, &fbyte, 1, process, ctx);
            cf_blockwise_accumulate(partial, npartial, nblock, &lbyte, 1, process, ctx);
            break;
    default:
            cf_blockwise_accumulate(partial, npartial, nblock, &fbyte, 1, process, ctx);

            /* If the middle and last bytes differ, then process the last byte separately.
             * Otherwise, just extend the middle block size. */
            if (lbyte != mbyte)
            {
              cf_blockwise_acc_byte(partial, npartial, nblock, mbyte, nbytes - 2, process, ctx);
              cf_blockwise_accumulate(partial, npartial, nblock, &lbyte, 1, process, ctx);
            } else {
              cf_blockwise_acc_byte(partial, npartial, nblock, mbyte, nbytes - 1, process, ctx);
            }

            break;
  }
}